

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::forEachXObject
          (QPDFPageObjectHelper *this,bool recursive,
          function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *action,function<bool_(QPDFObjectHandle)> *selector)

{
  BaseHandle *pBVar1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  bool bVar3;
  QPDFObjGen og;
  iterator iVar4;
  iterator iVar5;
  undefined7 in_register_00000031;
  list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> queue;
  set seen;
  QPDFObjectHandle xobj_dict;
  QPDFObjectHandle obj;
  allocator<char> local_f6;
  allocator<char> local_f5;
  int local_f4;
  function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70 [2];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50 [2];
  
  pBVar1 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  local_f4 = (int)CONCAT71(in_register_00000031,recursive);
  this_00 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 0x28);
  local_f0 = action;
  if (local_f4 == 0) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (this_00,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)this_00);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (this_00,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)this_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_impl.super__Rb_tree_header);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_allocated_capacity = (size_type)(local_e8 + 0x10);
  local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8._8_8_ = local_d8._M_allocated_capacity;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
  emplace_back<QPDFPageObjectHelper&>
            ((list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>> *)
             local_d8._M_allocated_capacity,this);
  do {
    uVar2 = local_d8._M_allocated_capacity;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_allocated_capacity ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 0x10)) {
      std::__cxx11::_List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::
      _M_clear((_List_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
               (local_e8 + 0x10));
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   *)(local_e8 + 0x28));
      return;
    }
    og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                   ((BaseHandle *)(local_d8._M_allocated_capacity + 0x18));
    bVar3 = QPDFObjGen::set::add((set *)(local_e8 + 0x28),og);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"/Resources",&local_f5);
      getAttribute((QPDFPageObjectHelper *)local_e8,(string *)(uVar2 + 0x10),SUB81(local_50,0));
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"/XObject",&local_f6);
      QPDFObjectHandle::getKeyIfDict((QPDFObjectHandle *)&local_80,(string *)local_e8);
      std::__cxx11::string::~string((string *)local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
      std::__cxx11::string::~string((string *)local_50);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(local_50,&local_80);
      iVar4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)local_50);
      iVar5 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)local_50);
      for (; iVar4._M_node != iVar5._M_node;
          iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node)) {
        bVar3 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar4._M_node + 2));
        if (!bVar3) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                              (iVar4._M_node + 2));
          if ((selector->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001a618c:
            std::
            function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(local_f0,(QPDFObjectHandle *)local_70,(QPDFObjectHandle *)&local_80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (iVar4._M_node + 1));
          }
          else {
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_90,local_70);
            bVar3 = std::function<bool_(QPDFObjectHandle)>::operator()
                              (selector,(QPDFObjectHandle *)&local_90);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
            if (bVar3) goto LAB_001a618c;
          }
          if ((char)local_f4 != '\0') {
            bVar3 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)local_70);
            if (bVar3) {
              std::__cxx11::list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>>::
              emplace_back<QPDFObjectHandle&>
                        ((list<QPDFPageObjectHelper,std::allocator<QPDFPageObjectHelper>> *)
                         (local_e8 + 0x10),(QPDFObjectHandle *)local_70);
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70[0]._M_refcount)
          ;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50[0]._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    }
    std::__cxx11::list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::pop_front
              ((list<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
               (local_e8 + 0x10));
  } while( true );
}

Assistant:

void
QPDFPageObjectHelper::forEachXObject(
    bool recursive,
    std::function<void(QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key)>
        action,
    std::function<bool(QPDFObjectHandle)> selector)
{
    QTC::TC(
        "qpdf",
        "QPDFPageObjectHelper::forEachXObject",
        recursive ? (oh().isFormXObject() ? 0 : 1) : (oh().isFormXObject() ? 2 : 3));
    QPDFObjGen::set seen;
    std::list<QPDFPageObjectHelper> queue;
    queue.emplace_back(*this);
    while (!queue.empty()) {
        auto& ph = queue.front();
        if (seen.add(ph)) {
            auto xobj_dict = ph.getAttribute("/Resources", false).getKeyIfDict("/XObject");
            for (auto const& [key, value]: xobj_dict.as_dictionary()) {
                if (value.null()) {
                    continue;
                }
                auto obj = value;
                if ((!selector) || selector(obj)) {
                    action(obj, xobj_dict, key);
                }
                if (recursive && obj.isFormXObject()) {
                    queue.emplace_back(obj);
                }
            }
        }
        queue.pop_front();
    }
}